

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_serial_dump.cpp
# Opt level: O3

vector<interface,_std::allocator<interface>_> *
parse_interfaces(vector<interface,_std::allocator<interface>_> *__return_storage_ptr__,
                variables_map *variables)

{
  pointer pbVar1;
  any *operand;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar2;
  runtime_error *this;
  pointer config_text;
  string *local_80 [2];
  string local_70;
  _Alloc_hider local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  (__return_storage_ptr__->super__Vector_base<interface,_std::allocator<interface>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<interface,_std::allocator<interface>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<interface,_std::allocator<interface>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_80[0] = &((interface *)local_80)->device_;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"interface","");
  operand = (any *)boost::program_options::abstract_variables_map::operator[]((string *)variables);
  pvVar2 = boost::
           any_cast<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&>
                     (operand);
  if (local_80[0] != &((interface *)local_80)->device_) {
    operator_delete(local_80[0]);
  }
  config_text = (pvVar2->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (pvVar2->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (config_text != pbVar1) {
    do {
      interface::interface((interface *)local_80,config_text);
      std::vector<interface,_std::allocator<interface>_>::emplace_back<interface>
                (__return_storage_ptr__,(interface *)local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)((long)&((interface *)local_80)->alias_ + 0x10U)) {
        operator_delete(local_50._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)((long)&((interface *)local_80)->device_ + 0x10U)) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      config_text = config_text + 1;
    } while (config_text != pbVar1);
  }
  if ((__return_storage_ptr__->super__Vector_base<interface,_std::allocator<interface>_>)._M_impl.
      super__Vector_impl_data._M_start !=
      (__return_storage_ptr__->super__Vector_base<interface,_std::allocator<interface>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    return __return_storage_ptr__;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"no interface defined");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::vector< interface > parse_interfaces( const po::variables_map& variables )
{
    std::vector< interface > result;

    for ( const auto& config : variables[ "interface" ].as< std::vector< std::string > >() )
        result.push_back( interface( config ) );

    if ( result.empty() )
        throw std::runtime_error( "no interface defined" );

    return result;
}